

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLcode Curl_multi_xfer_buf_borrow(Curl_easy *data,char **pbuf,size_t *pbuflen)

{
  ulong uVar1;
  char *pcVar2;
  Curl_multi *pCVar3;
  
  *pbuf = (char *)0x0;
  *pbuflen = 0;
  pCVar3 = data->multi;
  if (pCVar3 == (Curl_multi *)0x0) {
    pcVar2 = "transfer has no multi handle";
LAB_00145f31:
    Curl_failf(data,pcVar2);
    return CURLE_FAILED_INIT;
  }
  uVar1 = (ulong)(data->set).buffer_size;
  if (uVar1 == 0) {
    pcVar2 = "transfer buffer size is 0";
    goto LAB_00145f31;
  }
  if ((pCVar3->field_0x279 & 0x20) != 0) {
    Curl_failf(data,"attempt to borrow xfer_buf when already borrowed");
    return CURLE_AGAIN;
  }
  if (pCVar3->xfer_buf != (char *)0x0) {
    if (uVar1 <= pCVar3->xfer_buf_len) goto LAB_00145ef4;
    (*Curl_cfree)(pCVar3->xfer_buf);
    pCVar3 = data->multi;
    pCVar3->xfer_buf = (char *)0x0;
    pCVar3->xfer_buf_len = 0;
  }
  pcVar2 = (char *)(*Curl_cmalloc)((ulong)(data->set).buffer_size);
  pCVar3 = data->multi;
  pCVar3->xfer_buf = pcVar2;
  if (pcVar2 == (char *)0x0) {
    Curl_failf(data,"could not allocate xfer_buf of %zu bytes");
    return CURLE_OUT_OF_MEMORY;
  }
  pCVar3->xfer_buf_len = (ulong)(data->set).buffer_size;
LAB_00145ef4:
  pCVar3->field_0x279 = pCVar3->field_0x279 | 0x20;
  *pbuf = data->multi->xfer_buf;
  *pbuflen = data->multi->xfer_buf_len;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_multi_xfer_buf_borrow(struct Curl_easy *data,
                                    char **pbuf, size_t *pbuflen)
{
  DEBUGASSERT(data);
  DEBUGASSERT(data->multi);
  *pbuf = NULL;
  *pbuflen = 0;
  if(!data->multi) {
    failf(data, "transfer has no multi handle");
    return CURLE_FAILED_INIT;
  }
  if(!data->set.buffer_size) {
    failf(data, "transfer buffer size is 0");
    return CURLE_FAILED_INIT;
  }
  if(data->multi->xfer_buf_borrowed) {
    failf(data, "attempt to borrow xfer_buf when already borrowed");
    return CURLE_AGAIN;
  }

  if(data->multi->xfer_buf &&
     data->set.buffer_size > data->multi->xfer_buf_len) {
    /* not large enough, get a new one */
    free(data->multi->xfer_buf);
    data->multi->xfer_buf = NULL;
    data->multi->xfer_buf_len = 0;
  }

  if(!data->multi->xfer_buf) {
    data->multi->xfer_buf = malloc((size_t)data->set.buffer_size);
    if(!data->multi->xfer_buf) {
      failf(data, "could not allocate xfer_buf of %zu bytes",
            (size_t)data->set.buffer_size);
      return CURLE_OUT_OF_MEMORY;
    }
    data->multi->xfer_buf_len = data->set.buffer_size;
  }

  data->multi->xfer_buf_borrowed = TRUE;
  *pbuf = data->multi->xfer_buf;
  *pbuflen = data->multi->xfer_buf_len;
  return CURLE_OK;
}